

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-feeder-c-impl.h
# Opt level: O2

void __thiscall
mp::NLW2_NLFeeder_C_Impl::
FeedLinearConExpr<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::SingleSparseVecWrtFactory<int,double>>
          (NLW2_NLFeeder_C_Impl *this,int i,SingleSparseVecWrtFactory<int,_double> *clewf)

{
  int iVar1;
  SparseVectorWriter<int,_double> sv;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  iVar1 = (*(this->nlf2_c_).LinearConExprNNZ)((this->nlf2_c_).p_user_data_,i);
  if (iVar1 != 0) {
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::
    SingleSparseVecWrtFactory<int,_double>::MakeVectorWriter
              ((SingleSparseVecWrtFactory<int,_double> *)&stack0xffffffffffffffd0,(size_t)clewf);
    local_50._8_8_ = 0;
    local_38 = std::
               _Function_handler<void_(int,_double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/api/c/nl-feeder-c-impl.h:289:13)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(int,_double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/api/c/nl-feeder-c-impl.h:289:13)>
               ::_M_manager;
    local_50._M_unused._M_object =
         (SingleSparseVecWrtFactory<int,_double> *)&stack0xffffffffffffffd0;
    (*(this->nlf2_c_).FeedLinearConExpr)((this->nlf2_c_).p_user_data_,i,&local_50);
    std::_Function_base::~_Function_base((_Function_base *)&local_50);
  }
  return;
}

Assistant:

void FeedLinearConExpr(int i, ConLinearExprWriterFactory& clewf) {
    assert(NLF().LinearConExprNNZ);
    int nnz = NLF().LinearConExprNNZ(NLF().p_user_data_, i);
    if (nnz) {
      auto sv = clewf.MakeVectorWriter(nnz);
      assert(NLF().FeedLinearConExpr);
      std::function<void(int, double)> svw
          = [&sv](int i, double v){
        sv.Write(i, v);
      };
      NLF().FeedLinearConExpr(NLF().p_user_data_, i, &svw);
    }
  }